

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-ls.c
# Opt level: O2

void listbigfile_r(BigFile *bf,char *path)

{
  dirent *__ptr;
  long lVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  char *pcVar5;
  char *__dest_00;
  long lVar6;
  undefined8 uStack_e0;
  char acStack_d8 [8];
  undefined1 local_d0 [8];
  stat st;
  dirent **local_38;
  dirent **namelist;
  
  pcVar5 = bf->basename;
  uStack_e0 = 0x102445;
  sVar3 = strlen(pcVar5);
  uStack_e0 = 0x102450;
  sVar4 = strlen(path);
  lVar6 = -(sVar3 + sVar4 + 0x19 & 0xfffffffffffffff0);
  __dest = acStack_d8 + lVar6;
  if (sVar4 == 0) {
    *(undefined8 *)((long)&uStack_e0 + lVar6) = 0x10248e;
    strcpy(__dest,pcVar5);
  }
  else {
    *(undefined8 *)((long)&uStack_e0 + lVar6) = 0x102481;
    sprintf(__dest,"%s/%s",pcVar5,path);
  }
  *(undefined8 *)((long)&uStack_e0 + lVar6) = 0x1024a0;
  stat(__dest,(stat *)local_d0);
  if (((uint)st.st_nlink & 0xf000) == 0x4000) {
    *(undefined8 *)((long)&uStack_e0 + lVar6) = 0x1024cf;
    uVar2 = scandir(__dest,&local_38,filter,alphasort);
    if ((int)uVar2 < 0) {
      *(undefined8 *)((long)&uStack_e0 + lVar6) = 0x10259e;
      fprintf(_stderr,"cannot open dir: %s\n",__dest);
    }
    else {
      st.__glibc_reserved[2] = (__syscall_slong_t)uVar2;
      for (lVar6 = 0; st.__glibc_reserved[2] != lVar6; lVar6 = lVar6 + 1) {
        pcVar5 = local_38[lVar6]->d_name;
        __dest[-8] = -2;
        __dest[-7] = '$';
        __dest[-6] = '\x10';
        __dest[-5] = '\0';
        __dest[-4] = '\0';
        __dest[-3] = '\0';
        __dest[-2] = '\0';
        __dest[-1] = '\0';
        sVar3 = strlen(pcVar5);
        builtin_strncpy(__dest + -8,"\t%\x10",4);
        __dest[-4] = '\0';
        __dest[-3] = '\0';
        __dest[-2] = '\0';
        __dest[-1] = '\0';
        sVar4 = strlen(path);
        lVar1 = -(sVar4 + sVar3 + 0x19 & 0xfffffffffffffff0);
        __dest_00 = __dest + lVar1;
        if (sVar4 == 0) {
          builtin_strncpy(__dest + lVar1 + -8,"D%\x10",4);
          __dest_00[-4] = '\0';
          __dest_00[-3] = '\0';
          __dest_00[-2] = '\0';
          __dest_00[-1] = '\0';
          strcpy(__dest_00,pcVar5);
        }
        else {
          builtin_strncpy(__dest + lVar1 + -8,":%\x10",4);
          __dest_00[-4] = '\0';
          __dest_00[-3] = '\0';
          __dest_00[-2] = '\0';
          __dest_00[-1] = '\0';
          sprintf(__dest_00,"%s/%s",path,pcVar5);
        }
        builtin_strncpy(__dest + lVar1 + -8,"O%\x10",4);
        __dest_00[-4] = '\0';
        __dest_00[-3] = '\0';
        __dest_00[-2] = '\0';
        __dest_00[-1] = '\0';
        listbigblock(bf,__dest_00);
        builtin_strncpy(__dest + lVar1 + -8,"Z%\x10",4);
        __dest_00[-4] = '\0';
        __dest_00[-3] = '\0';
        __dest_00[-2] = '\0';
        __dest_00[-1] = '\0';
        listbigfile_r(bf,__dest_00);
        __ptr = local_38[lVar6];
        builtin_strncpy(__dest + lVar1 + -8,"g%\x10",4);
        __dest_00[-4] = '\0';
        __dest_00[-3] = '\0';
        __dest_00[-2] = '\0';
        __dest_00[-1] = '\0';
        free(__ptr);
        __dest = __dest_00;
      }
      builtin_strncpy(__dest + -8,"t%\x10",4);
      __dest[-4] = '\0';
      __dest[-3] = '\0';
      __dest[-2] = '\0';
      __dest[-1] = '\0';
      free(local_38);
    }
  }
  return;
}

Assistant:

static void listbigfile_r(BigFile * bf, char * path) {
    struct dirent **namelist;
    struct stat st;
    int n;
    char * buf = alloca(strlen(bf->basename) + strlen(path) + 10);
    if(strlen(path) > 0) 
        sprintf(buf, "%s/%s", bf->basename, path);
    else
        sprintf(buf, "%s", bf->basename);
    stat(buf, &st);
    if(!S_ISDIR(st.st_mode)) return;
    n = scandir(buf, &namelist, filter, alphasort);
    if (n < 0) {
        fprintf(stderr, "cannot open dir: %s\n", buf);
    } else {
        int i;
        for(i = 0; i < n ; i ++) {
            char * blockname = alloca(strlen(namelist[i]->d_name) + strlen(path) + 10);
            if(strlen(path) > 0) 
                sprintf(blockname, "%s/%s", path, namelist[i]->d_name);
            else
                sprintf(blockname, "%s", namelist[i]->d_name);
            listbigblock(bf, blockname);
            listbigfile_r(bf, blockname);
            free(namelist[i]);
        }
        free(namelist);
    }
}